

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void wherePartIdxExpr(Parse *pParse,Index *pIdx,Expr *pPart,Bitmask *pMask,int iIdxCur,
                     SrcItem *pItem)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  Expr *pEVar4;
  sqlite3 *db;
  IndexedExpr *pIVar5;
  u8 uVar6;
  uint uVar7;
  CollSeq *pCVar8;
  IndexedExpr *pIVar9;
  Expr *pEVar10;
  long in_FS_OFFSET;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = pPart->op;
  if (uVar6 == ',') {
    wherePartIdxExpr(pParse,pIdx,pPart->pRight,pMask,iIdxCur,pItem);
    pPart = pPart->pLeft;
    uVar6 = pPart->op;
  }
  if (((uVar6 == '6') || (uVar6 == '-')) && (pEVar4 = pPart->pLeft, pEVar4->op == 0xa8)) {
    pEVar10 = pPart->pRight;
    local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.walkerDepth = -0x55555556;
    local_68.eCode = 1;
    local_68.mWFlags = 0xaaaa;
    local_68.pParse = (Parse *)0x0;
    local_68.xExprCallback = exprNodeIsConstant;
    local_68.xSelectCallback = sqlite3SelectWalkFail;
    if (pEVar10 != (Expr *)0x0) {
      sqlite3WalkExprNN(&local_68,pEVar10);
      if (local_68.eCode == 0) goto LAB_0019401d;
    }
    uVar7 = pPart->flags & 0x400;
    pCVar8 = sqlite3BinaryCompareCollSeq
                       (pParse,*(Expr **)((long)&pPart->pLeft + (ulong)(uVar7 >> 7)),
                        (&pPart->pLeft)[uVar7 == 0]);
    if ((pCVar8 == (CollSeq *)0x0) || (pCVar8->xCmp == binCollFunc)) {
      uVar3 = pEVar4->iColumn;
      if ((-1 < (long)(short)uVar3) &&
         (bVar1 = pIdx->pTable->aCol[(short)uVar3].affinity, 0x41 < bVar1)) {
        if (pItem == (SrcItem *)0x0) {
          if (uVar3 < 0x3f) {
            bVar1 = (byte)uVar3 & 0x3f;
            *pMask = *pMask & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
          }
        }
        else {
          db = pParse->db;
          if (db == (sqlite3 *)0x0) {
            pIVar9 = (IndexedExpr *)sqlite3Malloc(0x20);
          }
          else {
            pIVar9 = (IndexedExpr *)sqlite3DbMallocRawNN(db,0x20);
          }
          if (pIVar9 != (IndexedExpr *)0x0) {
            bVar2 = (pItem->fg).jointype;
            if (pEVar10 == (Expr *)0x0) {
              pEVar10 = (Expr *)0x0;
            }
            else {
              pEVar10 = exprDup(db,pEVar10,0,(EdupBuf *)0x0);
            }
            pIVar9->pExpr = pEVar10;
            pIVar9->iDataCur = pItem->iCursor;
            pIVar9->iIdxCur = iIdxCur;
            pIVar9->iIdxCol = (int)pEVar4->iColumn;
            pIVar9->bMaybeNullRow = (bVar2 & 0x48) != 0;
            pIVar5 = pParse->pIdxPartExpr;
            pIVar9->pIENext = pIVar5;
            pIVar9->aff = bVar1;
            pParse->pIdxPartExpr = pIVar9;
            if (pIVar5 == (IndexedExpr *)0x0) {
              sqlite3ParserAddCleanup(pParse,whereIndexedExprCleanup,&pParse->pIdxPartExpr);
            }
          }
        }
      }
    }
  }
LAB_0019401d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void wherePartIdxExpr(
  Parse *pParse,                  /* Parse context */
  Index *pIdx,                    /* Partial index being processed */
  Expr *pPart,                    /* WHERE clause being processed */
  Bitmask *pMask,                 /* Mask to clear bits in */
  int iIdxCur,                    /* Cursor number for index */
  SrcItem *pItem                  /* The FROM clause entry for the table */
){
  assert( pItem==0 || (pItem->fg.jointype & JT_RIGHT)==0 );
  assert( (pItem==0 || pMask==0) && (pMask!=0 || pItem!=0) );

  if( pPart->op==TK_AND ){
    wherePartIdxExpr(pParse, pIdx, pPart->pRight, pMask, iIdxCur, pItem);
    pPart = pPart->pLeft;
  }

  if( (pPart->op==TK_EQ || pPart->op==TK_IS) ){
    Expr *pLeft = pPart->pLeft;
    Expr *pRight = pPart->pRight;
    u8 aff;

    if( pLeft->op!=TK_COLUMN ) return;
    if( !sqlite3ExprIsConstant(0, pRight) ) return;
    if( !sqlite3IsBinary(sqlite3ExprCompareCollSeq(pParse, pPart)) ) return;
    if( pLeft->iColumn<0 ) return;
    aff = pIdx->pTable->aCol[pLeft->iColumn].affinity;
    if( aff>=SQLITE_AFF_TEXT ){
      if( pItem ){
        sqlite3 *db = pParse->db;
        IndexedExpr *p = (IndexedExpr*)sqlite3DbMallocRaw(db, sizeof(*p));
        if( p ){
          int bNullRow = (pItem->fg.jointype&(JT_LEFT|JT_LTORJ))!=0;
          p->pExpr = sqlite3ExprDup(db, pRight, 0);
          p->iDataCur = pItem->iCursor;
          p->iIdxCur = iIdxCur;
          p->iIdxCol = pLeft->iColumn;
          p->bMaybeNullRow = bNullRow;
          p->pIENext = pParse->pIdxPartExpr;
          p->aff = aff;
          pParse->pIdxPartExpr = p;
          if( p->pIENext==0 ){
            void *pArg = (void*)&pParse->pIdxPartExpr;
            sqlite3ParserAddCleanup(pParse, whereIndexedExprCleanup, pArg);
          }
        }
      }else if( pLeft->iColumn<(BMS-1) ){
        *pMask &= ~((Bitmask)1 << pLeft->iColumn);
      }
    }
  }
}